

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDtdPtr xmlNewDtd(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlDtdPtr pxVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  if ((doc == (xmlDocPtr)0x0) || (doc->extSubset == (_xmlDtd *)0x0)) {
    pxVar1 = (xmlDtdPtr)(*xmlMalloc)(0x80);
    if (pxVar1 == (xmlDtdPtr)0x0) {
      pxVar1 = (xmlDtdPtr)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building DTD");
    }
    else {
      pxVar1->_private = (void *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->SystemID = (xmlChar *)0x0;
      pxVar1->pentities = (void *)0x0;
      pxVar1->entities = (xmlNs *)0x0;
      pxVar1->ExternalID = (xmlChar *)0x0;
      pxVar1->elements = (xmlChar *)0x0;
      pxVar1->attributes = (_xmlAttr *)0x0;
      pxVar1->doc = (_xmlDoc *)0x0;
      pxVar1->notations = (xmlNs *)0x0;
      pxVar1->next = (_xmlNode *)0x0;
      pxVar1->prev = (_xmlNode *)0x0;
      pxVar1->last = (_xmlNode *)0x0;
      pxVar1->parent = (_xmlDoc *)0x0;
      pxVar1->name = (xmlChar *)0x0;
      pxVar1->children = (_xmlNode *)0x0;
      pxVar1->type = XML_DTD_NODE;
      if (name != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(name);
        pxVar1->name = pxVar2;
      }
      if (ExternalID != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(ExternalID);
        pxVar1->ExternalID = pxVar2;
      }
      if (SystemID != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(SystemID);
        pxVar1->SystemID = pxVar2;
      }
      if (doc != (xmlDocPtr)0x0) {
        doc->extSubset = pxVar1;
      }
      pxVar1->doc = doc;
      if (__xmlRegisterCallbacks != 0) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        if (*pp_Var3 != (xmlRegisterNodeFunc)0x0) {
          pp_Var3 = __xmlRegisterNodeDefaultValue();
          (**pp_Var3)((xmlNodePtr)pxVar1);
        }
      }
    }
  }
  else {
    pxVar1 = (xmlDtdPtr)0x0;
  }
  return pxVar1;
}

Assistant:

xmlDtdPtr
xmlNewDtd(xmlDocPtr doc, const xmlChar *name,
                    const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if ((doc != NULL) && (doc->extSubset != NULL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewDtd(%s): document %s already have a DTD %s\n",
	    /* !!! */ (char *) name, doc->name,
	    /* !!! */ (char *)doc->extSubset->name);
#endif
	return(NULL);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL) {
	xmlTreeErrMemory("building DTD");
	return(NULL);
    }
    memset(cur, 0 , sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL)
	cur->name = xmlStrdup(name);
    if (ExternalID != NULL)
	cur->ExternalID = xmlStrdup(ExternalID);
    if (SystemID != NULL)
	cur->SystemID = xmlStrdup(SystemID);
    if (doc != NULL)
	doc->extSubset = cur;
    cur->doc = doc;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}